

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall FWeaponSlots::LocalSetup(FWeaponSlots *this,PClassActor *type)

{
  FGameConfigFile *pFVar1;
  bool bVar2;
  int iVar3;
  FString *this_00;
  char *pcVar4;
  FString local_20;
  FString sectionclass;
  PClassActor *type_local;
  FWeaponSlots *this_local;
  
  sectionclass.Chars = (char *)type;
  P_PlaybackKeyConfWeapons(this);
  bVar2 = FString::IsNotEmpty(&WeaponSection);
  pFVar1 = GameConfig;
  if (bVar2) {
    FString::FString(&local_20,&WeaponSection);
    this_00 = FString::operator<<(&local_20,'.');
    pcVar4 = FName::GetChars((FName *)(sectionclass.Chars + 0x88));
    FString::operator<<(this_00,pcVar4);
    pFVar1 = GameConfig;
    pcVar4 = FString::operator_cast_to_char_(&local_20);
    iVar3 = RestoreSlots(this,&pFVar1->super_FConfigFile,pcVar4);
    pFVar1 = GameConfig;
    if (iVar3 == 0) {
      pcVar4 = FString::operator_cast_to_char_(&WeaponSection);
      RestoreSlots(this,&pFVar1->super_FConfigFile,pcVar4);
    }
    FString::~FString(&local_20);
  }
  else {
    pcVar4 = FName::GetChars((FName *)(sectionclass.Chars + 0x88));
    RestoreSlots(this,&pFVar1->super_FConfigFile,pcVar4);
  }
  return;
}

Assistant:

void FWeaponSlots::LocalSetup(PClassActor *type)
{
	P_PlaybackKeyConfWeapons(this);
	if (WeaponSection.IsNotEmpty())
	{
		FString sectionclass(WeaponSection);
		sectionclass << '.' << type->TypeName.GetChars();
		if (RestoreSlots(GameConfig, sectionclass) == 0)
		{
			RestoreSlots(GameConfig, WeaponSection);
		}
	}
	else
	{
		RestoreSlots(GameConfig, type->TypeName.GetChars());
	}
}